

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lowmc_test.c
# Opt level: O3

int LowMC_test_vector_128_128_20_2(void)

{
  int iVar1;
  uint8_t ciphertext_expected [16];
  uint8_t plaintext [16];
  uint8_t key [16];
  uint8_t local_38 [56];
  
  local_38[0x20] = 0xb5;
  local_38[0x21] = 0xdf;
  local_38[0x22] = 'S';
  local_38[0x23] = '{';
  local_38[0x24] = '\0';
  local_38[0x25] = '\0';
  local_38[0x26] = '\0';
  local_38[0x27] = '\0';
  local_38[0x28] = '\0';
  local_38[0x29] = '\0';
  local_38[0x2a] = '\0';
  local_38[0x2b] = '\0';
  local_38[0x2c] = '\0';
  local_38[0x2d] = '\0';
  local_38[0x2e] = '\0';
  local_38[0x2f] = '\0';
  local_38[0x10] = 0xf7;
  local_38[0x11] = '}';
  local_38[0x12] = 0xb5;
  local_38[0x13] = '{';
  local_38[0x14] = '\0';
  local_38[0x15] = '\0';
  local_38[0x16] = '\0';
  local_38[0x17] = '\0';
  local_38[0x18] = '\0';
  local_38[0x19] = '\0';
  local_38[0x1a] = '\0';
  local_38[0x1b] = '\0';
  local_38[0x1c] = '\0';
  local_38[0x1d] = '\0';
  local_38[0x1e] = '\0';
  local_38[0x1f] = '\0';
  local_38[0] = '\x0e';
  local_38[1] = 'Y';
  local_38[2] = 'a';
  local_38[3] = 0xe9;
  local_38[4] = 0x99;
  local_38[5] = '!';
  local_38[6] = 'S';
  local_38[7] = 0xb1;
  local_38[8] = '2';
  local_38[9] = 'E';
  local_38[10] = 0xaf;
  local_38[0xb] = '$';
  local_38[0xc] = '=';
  local_38[0xd] = 0xd7;
  local_38[0xe] = 0xdd;
  local_38[0xf] = 0xc0;
  iVar1 = lowmc_enc(&parameters_128_128_20,local_38 + 0x20,local_38 + 0x10,local_38);
  return iVar1;
}

Assistant:

static int LowMC_test_vector_128_128_20_2(void) {
  const uint8_t key[16]                 = {0xB5, 0xDF, 0x53, 0x7B, 0x00, 0x00, 0x00, 0x00,
                           0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00};
  const uint8_t plaintext[16]           = {0xF7, 0x7D, 0xB5, 0x7B, 0x00, 0x00, 0x00, 0x00,
                                 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00};
  const uint8_t ciphertext_expected[16] = {0x0E, 0x59, 0x61, 0xE9, 0x99, 0x21, 0x53, 0xB1,
                                           0x32, 0x45, 0xAF, 0x24, 0x3D, 0xD7, 0xDD, 0xC0};

  return lowmc_enc(&parameters_128_128_20, key, plaintext, ciphertext_expected);
}